

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O0

void ipc_connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  ipc_client_ctx *ctx;
  int status_local;
  uv_connect_t *req_local;
  
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x9c,"0 == status");
    abort();
  }
  iVar1 = uv_read_start((uv_stream_t *)&req[1].type,ipc_alloc_cb,ipc_read_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x9f,"0 == uv_read_start((uv_stream_t*) &ctx->ipc_pipe, ipc_alloc_cb, ipc_read_cb)");
    abort();
  }
  return;
}

Assistant:

static void ipc_connect_cb(uv_connect_t* req, int status) {
  struct ipc_client_ctx* ctx;
  ctx = container_of(req, struct ipc_client_ctx, connect_req);
  ASSERT(0 == status);
  ASSERT(0 == uv_read_start((uv_stream_t*) &ctx->ipc_pipe,
                            ipc_alloc_cb,
                            ipc_read_cb));
}